

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<duckdb::hugeint_t,duckdb::uhugeint_t>
          (BaseAppender *this,Vector *col,hugeint_t input)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  bool bVar3;
  InvalidInputException *this_00;
  int64_t iVar4;
  hugeint_t input_00;
  uhugeint_t result;
  uhugeint_t local_58;
  string local_48;
  
  iVar4 = 0;
  bVar3 = TryCast::Operation<duckdb::hugeint_t,duckdb::uhugeint_t>(input,&local_58,false);
  if (bVar3) {
    pdVar1 = col->data;
    iVar2 = (this->chunk).count;
    *(uint64_t *)(pdVar1 + iVar2 * 0x10) = local_58.lower;
    *(uint64_t *)((long)(pdVar1 + iVar2 * 0x10) + 8) = local_58.upper;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_00.upper = iVar4;
  input_00.lower = input.upper;
  CastExceptionText<duckdb::hugeint_t,duckdb::uhugeint_t>(&local_48,(duckdb *)input.lower,input_00);
  InvalidInputException::InvalidInputException(this_00,&local_48);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}